

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O3

char chaiscript::boxed_cast<char>(Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  char cVar1;
  element_type *peVar2;
  type_info *ptVar3;
  type_info *ptVar4;
  bool bVar5;
  char *pcVar6;
  undefined8 *puVar7;
  Type_Info local_68;
  undefined *local_50;
  undefined *local_48;
  undefined4 local_40;
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_68.m_type_info = (type_info *)&char::typeinfo;
    local_68.m_bare_type_info = (type_info *)&char::typeinfo;
    local_68.m_flags = 0x10;
    bVar5 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,&local_68);
    if ((!bVar5) &&
       (bVar5 = Type_Conversions::convertable_type<char>(*(Type_Conversions **)t_conversions), bVar5
       )) {
      bVar5 = Type_Conversions::convertable_type<char>(*(Type_Conversions **)t_conversions);
      if (!bVar5) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x38);
        peVar2 = (bv->m_data).
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_68.m_flags = (peVar2->m_type_info).m_flags;
        local_68._20_4_ = *(undefined4 *)&(peVar2->m_type_info).field_0x14;
        ptVar3 = (peVar2->m_type_info).m_type_info;
        ptVar4 = (peVar2->m_type_info).m_bare_type_info;
        *puVar7 = &PTR__bad_cast_0019ca90;
        local_68.m_type_info._0_4_ = SUB84(ptVar3,0);
        local_68.m_type_info._4_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
        local_68.m_bare_type_info._0_4_ = SUB84(ptVar4,0);
        local_68.m_bare_type_info._4_4_ = (undefined4)((ulong)ptVar4 >> 0x20);
        *(undefined4 *)(puVar7 + 1) = local_68.m_type_info._0_4_;
        *(undefined4 *)((long)puVar7 + 0xc) = local_68.m_type_info._4_4_;
        *(undefined4 *)(puVar7 + 2) = local_68.m_bare_type_info._0_4_;
        *(undefined4 *)((long)puVar7 + 0x14) = local_68.m_bare_type_info._4_4_;
        puVar7[3] = local_68._16_8_;
        puVar7[4] = &char::typeinfo;
        puVar7[5] = 0x19;
        puVar7[6] = "Cannot perform boxed_cast";
        local_68.m_type_info = ptVar3;
        local_68.m_bare_type_info = ptVar4;
        __cxa_throw(puVar7,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      local_50 = &char::typeinfo;
      local_48 = &char::typeinfo;
      local_40 = 0x10;
      Type_Conversions::boxed_type_conversion
                ((Type_Conversions *)&local_68,*(Type_Info **)t_conversions,
                 (Conversion_Saves *)&local_50,*(Boxed_Value **)(t_conversions + 8));
      pcVar6 = (char *)detail::verify_type<void>
                                 ((Boxed_Value *)local_68.m_type_info,(type_info *)&char::typeinfo,
                                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                   (local_68.m_type_info + 0x28));
      cVar1 = *pcVar6;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.m_bare_type_info ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return cVar1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.m_bare_type_info);
      return cVar1;
    }
  }
  peVar2 = (bv->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar6 = (char *)detail::verify_type<void>
                             ((Boxed_Value *)peVar2,(type_info *)&char::typeinfo,
                              peVar2->m_const_data_ptr);
  return *pcVar6;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }